

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer *
SerializePointer<player_t>
          (FSerializer *arc,char *key,player_t **value,player_t **defval,player_t *base)

{
  uint uVar1;
  player_t *ppVar2;
  int64_t vv;
  
  if (base == (player_t *)0x0) {
    __assert_fail("base != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x59f,
                  "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = player_t]"
                 );
  }
  if (arc->r == (FReader *)0x0) {
    uVar1 = (arc->w->mInObject).Count;
    if (((uVar1 != 0) && (defval != (player_t **)0x0)) &&
       ((arc->w->mInObject).Array[uVar1 - 1] != false)) {
      ppVar2 = *value;
      if (ppVar2 == *defval) {
        return arc;
      }
      goto LAB_00474ea7;
    }
  }
  ppVar2 = *value;
LAB_00474ea7:
  if (ppVar2 == (player_t *)0x0) {
    vv = -1;
  }
  else {
    vv = ((long)ppVar2 - (long)base) / 0x2a0;
  }
  Serialize(arc,key,&vv,(int64_t *)0x0);
  ppVar2 = base + vv;
  if (vv < 0) {
    ppVar2 = (player_t *)0x0;
  }
  *value = ppVar2;
  return arc;
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}